

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O2

int RtMidiError_register(lua_State *L)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = luaL_newmetatable(L,"luartmidi.rtmidierror");
  if (iVar3 != 0) {
    lua_pushlstring(L,"__index",7);
    luaNewLib<6ul>(L,(luaL_Reg (*) [6])(anonymous_namespace)::RtMidiError_mt_index);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__tostring",10);
    lua_pushcclosure(L,anon_unknown.dwarf_1fce8::RtMidiError_getmessage,0);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__gc",4);
    lua_pushcclosure(L,anon_unknown.dwarf_1fce8::RtMidiError_dtor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_settop(L,0xfffffffffffffffe);
  lua_createtable(L,0,0);
  iVar3 = luaL_newmetatable(L,"luartmidi.rtmidierror.__class");
  if (iVar3 != 0) {
    lua_pushlstring(L,"__call",6);
    lua_pushcclosure(L,anon_unknown.dwarf_1fce8::RtMidiError_ctor,0);
    lua_rawset(L,0xfffffffffffffffd);
  }
  lua_setmetatable(L,0xfffffffffffffffe);
  lua_pushlstring(L,"Type",4);
  lua_createtable(L,0xb);
  for (lVar4 = 8; lVar4 != 0xb8; lVar4 = lVar4 + 0x10) {
    uVar2 = *(undefined8 *)((long)&(anonymous_namespace)::RTMIDIERROR_TYPE_VALUES + lVar4);
    lua_pushstring(L,uVar2);
    uVar1 = *(undefined4 *)((anonymous_namespace)::RtMidiError_mt_index + lVar4 + 0x58);
    lua_rawseti(L,0xfffffffffffffffe,uVar1);
    lua_pushstring(L,uVar2);
    lua_pushinteger(L,uVar1);
    lua_rawset(L,0xfffffffd);
  }
  lua_rawset(L,0xfffffffffffffffd);
  return 1;
}

Assistant:

LUA_RTMIDI_LOCAL int RtMidiError_register(lua_State *L) {
	// instance methods
	if (luaL_newmetatable(L, MT_RTMIDIERROR)) {
		lua_pushliteral(L, "__index");
		luaNewLib(L, RtMidiError_mt_index);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__tostring");
		lua_pushcfunction(L, RtMidiError_getmessage);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__gc");
		lua_pushcfunction(L, RtMidiError_dtor);
		lua_rawset(L, -3);
	}
	lua_pop(L, 1);

	// constructor
	lua_newtable(L);
	if (luaL_newmetatable(L, MT_RTMIDIERROR_CLASS)) {
		lua_pushliteral(L, "__call");
		lua_pushcfunction(L, RtMidiError_ctor);
		lua_rawset(L, -3);
	}
	lua_setmetatable(L, -2);

	lua_pushliteral(L, "Type");
	lua_createtable(L, ARRAY_SIZE(RTMIDIERROR_TYPE_VALUES), ARRAY_SIZE(RTMIDIERROR_TYPE_VALUES));
	for (const auto &p : RTMIDIERROR_TYPE_VALUES) {
		lua_pushstring(L, p.second);
		lua_rawseti(L, -2, p.first);
		lua_pushstring(L, p.second);
		lua_pushinteger(L, p.first);
		lua_rawset(L, -3);
	}
	lua_rawset(L, -3);

	return 1;
}